

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O3

int Min_CoverSuppVarNum(Min_Man_t *p,Min_Cube_t *pCover)

{
  uint *puVar1;
  Min_Cube_t *pMVar2;
  Min_Cube_t **ppMVar3;
  Min_Cube_t *pMVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  uint uVar14;
  ulong in_XMM9_Qa;
  uint uVar15;
  undefined8 in_XMM9_Qb;
  uint uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar25 [16];
  uint uVar24;
  
  if (pCover != (Min_Cube_t *)0x0) {
    uVar6 = *(uint *)&pCover->field_0x8;
    pMVar4 = pCover;
    if ((uVar6 & 0x3ffc00) != 0) {
      pMVar2 = p->pTemp;
      uVar5 = 0;
      do {
        pMVar2->uData[uVar5] = 0xffffffff;
        uVar5 = uVar5 + 1;
        uVar6 = *(uint *)&pCover->field_0x8;
      } while (uVar5 < (uVar6 >> 10 & 0xfff));
    }
    do {
      if ((uVar6 & 0x3ffc00) != 0) {
        pMVar2 = p->pTemp;
        uVar5 = 0;
        do {
          puVar1 = pMVar2->uData + uVar5;
          *puVar1 = *puVar1 & pMVar4->uData[uVar5];
          uVar5 = uVar5 + 1;
          uVar6 = *(uint *)&pCover->field_0x8;
        } while (uVar5 < (uVar6 >> 10 & 0xfff));
      }
      ppMVar3 = &pMVar4->pNext;
      pMVar4 = *ppMVar3;
    } while (*ppMVar3 != (Min_Cube_t *)0x0);
    uVar6 = uVar6 & 0x3ff;
    if (uVar6 != 0) {
      pMVar4 = p->pTemp;
      uVar7 = uVar6 - 1;
      uVar9 = 0;
      uVar10 = 1;
      uVar11 = 2;
      uVar12 = 3;
      uVar8 = 0;
      auVar20 = (undefined1  [16])0x0;
      do {
        auVar18 = auVar20;
        auVar13._0_4_ = -(uint)((int)(uVar7 ^ 0x80000000) < (int)(uVar9 ^ 0x80000000));
        auVar13._4_4_ = -(uint)((int)(uVar7 ^ 0x80000000) < (int)(uVar10 ^ 0x80000000));
        auVar13._8_4_ = -(uint)((int)(uVar7 ^ 0x80000000) < (int)(uVar11 ^ 0x80000000));
        auVar13._12_4_ = -(uint)((int)(uVar7 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000));
        if ((~auVar13._0_4_ & 1) != 0) {
          in_XMM9_Qa = (ulong)pMVar4->uData[uVar8 >> 4];
          in_XMM9_Qb = 0;
        }
        auVar25._8_4_ = 0xffffffff;
        auVar25._0_8_ = 0xffffffffffffffff;
        auVar25._12_4_ = 0xffffffff;
        auVar19 = auVar13 ^ auVar25;
        if ((auVar19 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          in_XMM9_Qa = CONCAT44(pMVar4->uData[uVar8 >> 4],(int)in_XMM9_Qa);
        }
        uVar14 = (uint)in_XMM9_Qa;
        if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          in_XMM9_Qb = CONCAT44((int)((ulong)in_XMM9_Qb >> 0x20),pMVar4->uData[uVar8 >> 4]);
        }
        if ((auVar19 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          auVar19._4_4_ = 0;
          auVar19._0_4_ = pMVar4->uData[uVar8 >> 4];
          auVar19._8_4_ = (int)in_XMM9_Qb;
          auVar19._12_4_ = (int)((ulong)in_XMM9_Qb >> 0x20);
          in_XMM9_Qb = CONCAT44(pMVar4->uData[uVar8 >> 4],(int)in_XMM9_Qb);
        }
        auVar21._4_4_ = uVar10 * 2;
        auVar21._0_4_ = uVar9 * 2;
        auVar21._8_4_ = uVar11 * 2;
        auVar21._12_4_ = uVar12 * 2;
        auVar21 = auVar21 & _DAT_008b6380;
        auVar20 = pshuflw(auVar19,auVar21,0xfe);
        uVar15 = (uint)in_XMM9_Qb;
        uVar16 = (uint)((ulong)in_XMM9_Qb >> 0x20);
        lVar17 = auVar20._0_8_;
        auVar23._0_4_ = uVar14 >> lVar17;
        uVar24 = (uint)(in_XMM9_Qa >> 0x20);
        auVar23._4_4_ = uVar24 >> lVar17;
        auVar23._8_4_ = uVar15 >> lVar17;
        auVar23._12_4_ = uVar16 >> lVar17;
        auVar25 = pshuflw(in_XMM13,auVar21,0x54);
        auVar22._8_4_ = auVar21._8_4_;
        auVar22._12_4_ = auVar21._12_4_;
        auVar22._0_8_ = auVar21._8_8_;
        auVar20 = pshuflw(auVar23,auVar22,0xfe);
        lVar17 = auVar20._0_8_;
        in_XMM13._0_4_ = uVar14 >> lVar17;
        in_XMM13._4_4_ = uVar24 >> lVar17;
        in_XMM13._8_4_ = uVar15 >> lVar17;
        in_XMM13._12_4_ = uVar16 >> lVar17;
        auVar20 = pshuflw(auVar22,auVar22,0x54);
        uVar15 = uVar15 >> auVar20._0_8_;
        in_XMM9_Qa = CONCAT44(uVar16 >> auVar20._0_8_,uVar15);
        in_XMM9_Qb = in_XMM13._8_8_;
        auVar20._0_4_ = (auVar18._0_4_ - (uint)((uVar14 >> auVar25._0_8_ & 3) == 3)) + 1;
        auVar20._4_4_ = (auVar18._4_4_ - (uint)((auVar23._4_4_ & 3) == 3)) + 1;
        auVar20._8_4_ = (auVar18._8_4_ - (uint)((uVar15 & 3) == 3)) + 1;
        auVar20._12_4_ = (auVar18._12_4_ - (uint)((in_XMM13._12_4_ & 3) == 3)) + 1;
        uVar8 = uVar8 + 4;
        uVar9 = uVar9 + 4;
        uVar10 = uVar10 + 4;
        uVar11 = uVar11 + 4;
        uVar12 = uVar12 + 4;
      } while ((uVar6 + 3 & 0xfffffffc) != uVar8);
      auVar20 = ~auVar13 & auVar20 | auVar18 & auVar13;
      return auVar20._12_4_ + auVar20._4_4_ + auVar20._8_4_ + auVar20._0_4_;
    }
  }
  return 0;
}

Assistant:

int Min_CoverSuppVarNum( Min_Man_t * p, Min_Cube_t * pCover )
{
    Min_Cube_t * pCube;
    int i, Counter;
    if ( pCover == NULL )
        return 0;
    // clean the cube
    for ( i = 0; i < (int)pCover->nWords; i++ )
        p->pTemp->uData[i]  = ~((unsigned)0);
    // add the bit data
    Min_CoverForEachCube( pCover, pCube )
        for ( i = 0; i < (int)pCover->nWords; i++ )
            p->pTemp->uData[i] &= pCube->uData[i];
    // count the vars
    Counter = 0;
    for ( i = 0; i < (int)pCover->nVars; i++ )
        Counter += ( Min_CubeGetVar(p->pTemp, i) != 3 );
    return Counter;
}